

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall helics::Federate::updateFederateMode(Federate *this,Modes newMode)

{
  Modes MVar1;
  bool bVar2;
  Modes in_SIL;
  long in_RDI;
  Modes oldMode;
  Modes in_stack_ffffffffffffffde;
  Modes in_stack_ffffffffffffffdf;
  function<void_(helics::Federate::Modes,_helics::Federate::Modes)> *in_stack_ffffffffffffffe0;
  
  MVar1 = CLI::std::atomic<helics::Federate::Modes>::load
                    ((atomic<helics::Federate::Modes> *)(in_RDI + 8),seq_cst);
  std::atomic<helics::Federate::Modes>::store
            ((atomic<helics::Federate::Modes> *)(in_RDI + 8),in_SIL,seq_cst);
  if ((((in_SIL != MVar1) && (in_SIL != PENDING_EXEC)) && (in_SIL != PENDING_INIT)) &&
     (((in_SIL != PENDING_ITERATIVE_TIME && (in_SIL != PENDING_TIME)) &&
      (in_SIL != PENDING_FINALIZE)))) {
    bVar2 = std::function::operator_cast_to_bool
                      ((function<void_(helics::Federate::Modes,_helics::Federate::Modes)> *)0x2539ec
                      );
    if (bVar2) {
      in_stack_ffffffffffffffe0 =
           (function<void_(helics::Federate::Modes,_helics::Federate::Modes)> *)(ulong)MVar1;
      switch(in_stack_ffffffffffffffe0) {
      case (function<void_(helics::Federate::Modes,_helics::Federate::Modes)> *)0x0:
      case (function<void_(helics::Federate::Modes,_helics::Federate::Modes)> *)0x1:
      case (function<void_(helics::Federate::Modes,_helics::Federate::Modes)> *)0x2:
      case (function<void_(helics::Federate::Modes,_helics::Federate::Modes)> *)0x3:
      case (function<void_(helics::Federate::Modes,_helics::Federate::Modes)> *)0x4:
      case (function<void_(helics::Federate::Modes,_helics::Federate::Modes)> *)0xa:
        std::function<void_(helics::Federate::Modes,_helics::Federate::Modes)>::operator()
                  (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdf,in_stack_ffffffffffffffde);
        break;
      case (function<void_(helics::Federate::Modes,_helics::Federate::Modes)> *)0x5:
        std::function<void_(helics::Federate::Modes,_helics::Federate::Modes)>::operator()
                  (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdf,in_stack_ffffffffffffffde);
        break;
      case (function<void_(helics::Federate::Modes,_helics::Federate::Modes)> *)0x6:
        if (in_SIL != INITIALIZING) {
          std::function<void_(helics::Federate::Modes,_helics::Federate::Modes)>::operator()
                    (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdf,in_stack_ffffffffffffffde);
        }
        break;
      case (function<void_(helics::Federate::Modes,_helics::Federate::Modes)> *)0x7:
      case (function<void_(helics::Federate::Modes,_helics::Federate::Modes)> *)0x8:
        if (in_SIL != EXECUTING) {
          std::function<void_(helics::Federate::Modes,_helics::Federate::Modes)>::operator()
                    (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdf,in_stack_ffffffffffffffde);
        }
        break;
      case (function<void_(helics::Federate::Modes,_helics::Federate::Modes)> *)0x9:
        std::function<void_(helics::Federate::Modes,_helics::Federate::Modes)>::operator()
                  (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdf,in_stack_ffffffffffffffde);
        break;
      case (function<void_(helics::Federate::Modes,_helics::Federate::Modes)> *)0xc:
      }
    }
    bVar2 = std::function::operator_cast_to_bool((function<void_()> *)0x253ad5);
    if (((bVar2) && (in_SIL == EXECUTING)) && ((MVar1 == INITIALIZING || (MVar1 == PENDING_EXEC))))
    {
      CLI::std::function<void_()>::operator()((function<void_()> *)in_stack_ffffffffffffffe0);
    }
    if (((in_SIL == FINALIZE) || (in_SIL == ERROR_STATE)) &&
       (bVar2 = std::function::operator_cast_to_bool((function<void_()> *)0x253b22), bVar2)) {
      CLI::std::function<void_()>::operator()((function<void_()> *)in_stack_ffffffffffffffe0);
    }
  }
  return;
}

Assistant:

void Federate::updateFederateMode(Modes newMode)
{
    const Modes oldMode = currentMode.load();
    currentMode.store(newMode);
    if (newMode == oldMode) {
        return;
    }
    if (newMode == Modes::PENDING_EXEC || newMode == Modes::PENDING_INIT ||
        newMode == Modes::PENDING_ITERATIVE_TIME || newMode == Modes::PENDING_TIME ||
        newMode == Modes::PENDING_FINALIZE) {
        return;
    }
    if (modeUpdateCallback) {
        switch (oldMode) {
            case Modes::PENDING_ITERATIVE_INIT:
                break;
            case Modes::PENDING_INIT:
                modeUpdateCallback(newMode, Modes::STARTUP);
                break;
            case Modes::PENDING_EXEC:
                if (newMode != Modes::INITIALIZING) {
                    modeUpdateCallback(newMode, Modes::INITIALIZING);
                }
                break;
            case Modes::PENDING_ITERATIVE_TIME:
            case Modes::PENDING_TIME:
                if (newMode != Modes::EXECUTING) {
                    modeUpdateCallback(newMode, Modes::EXECUTING);
                }
                break;
            case Modes::PENDING_FINALIZE:
                modeUpdateCallback(newMode, Modes::EXECUTING);
                break;
            case Modes::FINALIZE:
            case Modes::INITIALIZING:
            case Modes::EXECUTING:
            case Modes::FINISHED:
            case Modes::ERROR_STATE:
            case Modes::STARTUP:
                modeUpdateCallback(newMode, oldMode);
                break;
        }
    }
    if (executingEntryCallback) {
        if (newMode == Modes::EXECUTING &&
            (oldMode == Modes::INITIALIZING || oldMode == Modes::PENDING_EXEC)) {
            executingEntryCallback();
        }
    }
    if (newMode == Modes::FINALIZE || newMode == Modes::ERROR_STATE) {
        if (cosimulationTerminationCallback) {
            cosimulationTerminationCallback();
        }
    }
}